

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

uint8_t av1_get_pred_context_seg_id(MACROBLOCKD *xd)

{
  byte local_28;
  byte local_24;
  int left_sip;
  int above_sip;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  MACROBLOCKD *xd_local;
  
  if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = (byte)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3) & 1;
  }
  if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = (byte)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3) & 1;
  }
  return local_24 + local_28;
}

Assistant:

static inline uint8_t av1_get_pred_context_seg_id(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  const int above_sip = (above_mi != NULL) ? above_mi->seg_id_predicted : 0;
  const int left_sip = (left_mi != NULL) ? left_mi->seg_id_predicted : 0;

  return above_sip + left_sip;
}